

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 (*pauVar7) [32];
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar18 [32];
  float fVar22;
  undefined1 auVar19 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar11 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar11 = uVar12;
  }
  auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar7 = (undefined1 (*) [32])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
    lVar10 = 0;
    for (iVar9 = 0; auVar38 = auVar39._0_16_, iVar9 + 7 < iVar8; iVar9 = iVar9 + 8) {
      auVar1 = *pauVar7;
      auVar18._0_8_ = auVar1._0_8_ ^ 0x8000000080000000;
      auVar18._8_4_ = -auVar1._8_4_;
      auVar18._12_4_ = -auVar1._12_4_;
      auVar18._16_4_ = -auVar1._16_4_;
      auVar18._20_4_ = -auVar1._20_4_;
      auVar18._24_4_ = -auVar1._24_4_;
      auVar18._28_4_ = auVar1._28_4_ ^ 0x80000000;
      auVar31._8_4_ = 0x42b0c0a5;
      auVar31._0_8_ = 0x42b0c0a542b0c0a5;
      auVar31._12_4_ = 0x42b0c0a5;
      auVar31._16_4_ = 0x42b0c0a5;
      auVar31._20_4_ = 0x42b0c0a5;
      auVar31._24_4_ = 0x42b0c0a5;
      auVar31._28_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar31);
      auVar32._8_4_ = 0xc2b0c0a5;
      auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._12_4_ = 0xc2b0c0a5;
      auVar32._16_4_ = 0xc2b0c0a5;
      auVar32._20_4_ = 0xc2b0c0a5;
      auVar32._24_4_ = 0xc2b0c0a5;
      auVar32._28_4_ = 0xc2b0c0a5;
      auVar5 = vmaxps_avx(auVar18,auVar32);
      auVar33._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
      auVar33._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
      auVar33._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
      auVar33._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
      auVar33._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
      auVar33._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
      auVar33._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
      auVar33._28_4_ = 0x3ff8aa3b;
      auVar14 = vroundps_avx(auVar33,1);
      auVar18 = vcmpps_avx(auVar33,auVar14,1);
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar37._16_4_ = 0x3f800000;
      auVar37._20_4_ = 0x3f800000;
      auVar37._24_4_ = 0x3f800000;
      auVar37._28_4_ = 0x3f800000;
      auVar18 = vandps_avx(auVar18,auVar37);
      auVar18 = vsubps_avx(auVar14,auVar18);
      fVar15 = auVar5._0_4_ + auVar18._0_4_ * -0.6931472;
      fVar20 = auVar5._4_4_ + auVar18._4_4_ * -0.6931472;
      fVar21 = auVar5._8_4_ + auVar18._8_4_ * -0.6931472;
      fVar22 = auVar5._12_4_ + auVar18._12_4_ * -0.6931472;
      fVar23 = auVar5._16_4_ + auVar18._16_4_ * -0.6931472;
      fVar24 = auVar5._20_4_ + auVar18._20_4_ * -0.6931472;
      fVar25 = auVar5._24_4_ + auVar18._24_4_ * -0.6931472;
      auVar26._0_4_ = (int)auVar18._0_4_;
      auVar26._4_4_ = (int)auVar18._4_4_;
      auVar26._8_4_ = (int)auVar18._8_4_;
      auVar26._12_4_ = (int)auVar18._12_4_;
      auVar34._16_4_ = (int)auVar18._16_4_;
      auVar34._0_16_ = auVar26;
      auVar34._20_4_ = (int)auVar18._20_4_;
      auVar34._24_4_ = (int)auVar18._24_4_;
      auVar34._28_4_ = (int)auVar18._28_4_;
      auVar35 = vpslld_avx(auVar26,0x17);
      auVar26 = vpslld_avx(auVar34._16_16_,0x17);
      auVar26 = vpaddd_avx(auVar38,auVar26);
      auVar38 = vpaddd_avx(auVar38,auVar35);
      auVar19._0_4_ =
           (fVar15 + 1.0 +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar38._0_4_ + 1.0;
      auVar19._4_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar38._4_4_ + 1.0;
      auVar19._8_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar38._8_4_ + 1.0;
      auVar19._12_4_ =
           (fVar22 + 1.0 +
           fVar22 * fVar22 *
           (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
             0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar38._12_4_ + 1.0;
      auVar19._16_4_ =
           (fVar23 + 1.0 +
           fVar23 * fVar23 *
           (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
             0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5)) * auVar26._0_4_ + 1.0;
      auVar19._20_4_ =
           (fVar24 + 1.0 +
           fVar24 * fVar24 *
           (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
             0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5)) * auVar26._4_4_ + 1.0;
      auVar19._24_4_ =
           (fVar25 + 1.0 +
           fVar25 * fVar25 *
           (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
             0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar26._8_4_ + 1.0;
      auVar19._28_4_ = auVar5._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar18 = vrcpps_avx(auVar19);
      fVar15 = auVar1._0_4_ * auVar18._0_4_;
      fVar20 = auVar1._4_4_ * auVar18._4_4_;
      fVar21 = auVar1._8_4_ * auVar18._8_4_;
      fVar22 = auVar1._12_4_ * auVar18._12_4_;
      fVar23 = auVar1._16_4_ * auVar18._16_4_;
      fVar24 = auVar1._20_4_ * auVar18._20_4_;
      fVar25 = auVar1._24_4_ * auVar18._24_4_;
      auVar5._4_4_ = auVar19._4_4_ * fVar20;
      auVar5._0_4_ = auVar19._0_4_ * fVar15;
      auVar5._8_4_ = auVar19._8_4_ * fVar21;
      auVar5._12_4_ = auVar19._12_4_ * fVar22;
      auVar5._16_4_ = auVar19._16_4_ * fVar23;
      auVar5._20_4_ = auVar19._20_4_ * fVar24;
      auVar5._24_4_ = auVar19._24_4_ * fVar25;
      auVar5._28_4_ = auVar19._28_4_;
      auVar1 = vsubps_avx(auVar1,auVar5);
      auVar14._0_4_ = fVar15 + auVar18._0_4_ * auVar1._0_4_;
      auVar14._4_4_ = fVar20 + auVar18._4_4_ * auVar1._4_4_;
      auVar14._8_4_ = fVar21 + auVar18._8_4_ * auVar1._8_4_;
      auVar14._12_4_ = fVar22 + auVar18._12_4_ * auVar1._12_4_;
      auVar14._16_4_ = fVar23 + auVar18._16_4_ * auVar1._16_4_;
      auVar14._20_4_ = fVar24 + auVar18._20_4_ * auVar1._20_4_;
      auVar14._24_4_ = fVar25 + auVar18._24_4_ * auVar1._24_4_;
      auVar14._28_4_ = auVar1._28_4_ + 0.0;
      *pauVar7 = auVar14;
      pauVar7 = pauVar7 + 1;
      lVar10 = lVar10 + 8;
    }
    for (; iVar9 + 3 < iVar8; iVar9 = iVar9 + 4) {
      auVar26 = *(undefined1 (*) [16])*pauVar7;
      auVar35._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = -auVar26._8_4_;
      auVar35._12_4_ = -auVar26._12_4_;
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar35 = vminps_avx(auVar35,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar16 = vmaxps_avx(auVar35,auVar28);
      auVar29._0_4_ = auVar16._0_4_ * 1.442695 + 0.5;
      auVar29._4_4_ = auVar16._4_4_ * 1.442695 + 0.5;
      auVar29._8_4_ = auVar16._8_4_ * 1.442695 + 0.5;
      auVar29._12_4_ = auVar16._12_4_ * 1.442695 + 0.5;
      auVar36._0_4_ = (int)auVar29._0_4_;
      auVar36._4_4_ = (int)auVar29._4_4_;
      auVar36._8_4_ = (int)auVar29._8_4_;
      auVar36._12_4_ = (int)auVar29._12_4_;
      auVar13 = vcvtdq2ps_avx(auVar36);
      auVar35 = vcmpps_avx(auVar29,auVar13,1);
      auVar35 = vandps_avx(auVar38,auVar35);
      auVar35 = vsubps_avx(auVar13,auVar35);
      fVar15 = auVar16._0_4_ + auVar35._0_4_ * -0.6931472;
      fVar20 = auVar16._4_4_ + auVar35._4_4_ * -0.6931472;
      fVar21 = auVar16._8_4_ + auVar35._8_4_ * -0.6931472;
      fVar22 = auVar16._12_4_ + auVar35._12_4_ * -0.6931472;
      auVar30._0_4_ = (int)auVar35._0_4_;
      auVar30._4_4_ = (int)auVar35._4_4_;
      auVar30._8_4_ = (int)auVar35._8_4_;
      auVar30._12_4_ = (int)auVar35._12_4_;
      auVar35 = vpslld_avx(auVar30,0x17);
      auVar35 = vpaddd_avx(auVar38,auVar35);
      auVar16._0_4_ =
           auVar39._0_4_ +
           (auVar39._0_4_ + fVar15 +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar35._0_4_;
      auVar16._4_4_ =
           auVar39._4_4_ +
           (auVar39._4_4_ + fVar20 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar35._4_4_;
      auVar16._8_4_ =
           auVar39._8_4_ +
           (auVar39._8_4_ + fVar21 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar35._8_4_;
      auVar16._12_4_ =
           auVar39._12_4_ +
           (auVar39._12_4_ + fVar22 +
           fVar22 * fVar22 *
           (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
             0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar35._12_4_;
      auVar35 = vrcpps_avx(auVar16);
      fVar15 = auVar26._0_4_ * auVar35._0_4_;
      fVar20 = auVar26._4_4_ * auVar35._4_4_;
      fVar21 = auVar26._8_4_ * auVar35._8_4_;
      fVar22 = auVar26._12_4_ * auVar35._12_4_;
      auVar17._0_4_ = auVar16._0_4_ * fVar15;
      auVar17._4_4_ = auVar16._4_4_ * fVar20;
      auVar17._8_4_ = auVar16._8_4_ * fVar21;
      auVar17._12_4_ = auVar16._12_4_ * fVar22;
      auVar26 = vsubps_avx(auVar26,auVar17);
      auVar13._0_4_ = fVar15 + auVar35._0_4_ * auVar26._0_4_;
      auVar13._4_4_ = fVar20 + auVar35._4_4_ * auVar26._4_4_;
      auVar13._8_4_ = fVar21 + auVar35._8_4_ * auVar26._8_4_;
      auVar13._12_4_ = fVar22 + auVar35._12_4_ * auVar26._12_4_;
      *(undefined1 (*) [16])*pauVar7 = auVar13;
      pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
      lVar10 = lVar10 + 4;
    }
    lVar6 = sVar4 * sVar3 * uVar12;
    for (; (int)lVar10 < iVar8; lVar10 = lVar10 + 1) {
      fVar15 = *(float *)((long)pvVar2 + lVar10 * 4 + lVar6);
      fVar20 = expf(-fVar15);
      auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar2 + lVar10 * 4 + lVar6) = fVar15 / (fVar20 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}